

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLStream.cpp
# Opt level: O0

ssize_t __thiscall
ODDLParser::IOStreamBase::write(IOStreamBase *this,int __fd,void *__buf,size_t __n)

{
  void *__ptr;
  size_t __n_00;
  undefined4 in_register_00000034;
  string local_40 [8];
  string formatStatement;
  string *statement_local;
  IOStreamBase *this_local;
  
  formatStatement.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
  if (this->m_file == (FILE *)0x0) {
    this_local = (IOStreamBase *)0x0;
  }
  else {
    (*this->m_formatter->_vptr_StreamFormatterBase[2])
              (local_40,this->m_formatter,formatStatement.field_2._8_8_);
    __ptr = (void *)std::__cxx11::string::c_str();
    __n_00 = std::__cxx11::string::size();
    this_local = (IOStreamBase *)fwrite(__ptr,1,__n_00,(FILE *)this->m_file);
    std::__cxx11::string::~string(local_40);
  }
  return (ssize_t)this_local;
}

Assistant:

size_t IOStreamBase::write(const std::string &statement) {
    if (ddl_nullptr == m_file) {
        return 0;
    }
    std::string formatStatement = m_formatter->format(statement);
    return ::fwrite(formatStatement.c_str(), sizeof(char), formatStatement.size(), m_file);
}